

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagateNoContraction.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_160047c::TSymbolDefinitionCollectingTraverser::visitSymbol
          (TSymbolDefinitionCollectingTraverser *this,TIntermSymbol *node)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int extraout_var;
  long *plVar5;
  mapped_type *pmVar6;
  long *plVar7;
  TIntermSymbol *pTVar8;
  uint __len;
  ulong __val;
  ObjectAccessChain symbol_id;
  string __str;
  TIntermSymbol *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  long *local_50 [2];
  long local_40 [2];
  ulong uVar4;
  
  iVar3 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(node);
  uVar4 = CONCAT44(extraout_var,iVar3);
  __val = -uVar4;
  if (0 < (long)uVar4) {
    __val = uVar4;
  }
  __len = 1;
  if (9 < __val) {
    uVar4 = __val;
    uVar2 = 4;
    do {
      __len = uVar2;
      if (uVar4 < 100) {
        __len = __len - 2;
        goto LAB_004ce8fe;
      }
      if (uVar4 < 1000) {
        __len = __len - 1;
        goto LAB_004ce8fe;
      }
      if (uVar4 < 10000) goto LAB_004ce8fe;
      bVar1 = 99999 < uVar4;
      uVar4 = uVar4 / 10000;
      uVar2 = __len + 4;
    } while (bVar1);
    __len = __len + 1;
  }
LAB_004ce8fe:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)(extraout_var >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_long_long>
            ((char *)((long)local_50[0] - ((long)extraout_var >> 0x1f)),__len,__val);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_60 = *plVar7;
    uStack_58 = (undefined4)plVar5[3];
    uStack_54 = *(undefined4 *)((long)plVar5 + 0x1c);
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar7;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(node);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  pTVar8 = (TIntermSymbol *)(plVar5 + 2);
  if ((TIntermSymbol *)*plVar5 == pTVar8) {
    local_a0._0_8_ = (pTVar8->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode;
    local_a0._8_8_ = plVar5[3];
    local_b0 = (TIntermSymbol *)local_a0;
  }
  else {
    local_a0._0_8_ = (pTVar8->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode;
    local_b0 = (TIntermSymbol *)*plVar5;
  }
  local_a8 = plVar5[1];
  *plVar5 = (long)pTVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar5[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar7;
    local_90 = (long *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_b0 != (TIntermSymbol *)local_a0) {
    operator_delete(local_b0,local_a0._0_8_ + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  std::__cxx11::string::operator=((string *)&this->current_object_,(string *)&local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  local_b0 = node;
  pmVar6 = std::__detail::
           _Map_base<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this->accesschain_mapping_,(key_type *)&local_b0);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  return;
}

Assistant:

void TSymbolDefinitionCollectingTraverser::visitSymbol(glslang::TIntermSymbol* node)
{
    current_object_ = generateSymbolLabel(node);
    accesschain_mapping_[node] = current_object_;
}